

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acto.h
# Opt level: O0

bool __thiscall
acto::actor_ref::send<msg_start,int_const&,acto::actor_ref&>(actor_ref *this,int *p,actor_ref *p_1)

{
  unique_ptr<acto::core::msg_wrap_t<msg_start>,_std::default_delete<acto::core::msg_wrap_t<msg_start>_>_>
  local_38;
  unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_> local_30;
  actor_ref *local_28;
  actor_ref *p_local_1;
  int *p_local;
  actor_ref *this_local;
  
  if (this->object_ == (object_t *)0x0) {
    this_local._7_1_ = 0;
  }
  else {
    local_28 = p_1;
    p_local_1 = (actor_ref *)p;
    p_local = (int *)this;
    std::make_unique<acto::core::msg_wrap_t<msg_start>,int_const&,acto::actor_ref&>
              ((int *)&local_38,(actor_ref *)p);
    std::unique_ptr<acto::core::msg_t,std::default_delete<acto::core::msg_t>>::
    unique_ptr<acto::core::msg_wrap_t<msg_start>,std::default_delete<acto::core::msg_wrap_t<msg_start>>,void>
              ((unique_ptr<acto::core::msg_t,std::default_delete<acto::core::msg_t>> *)&local_30,
               &local_38);
    this_local._7_1_ = send_message(this,&local_30);
    std::unique_ptr<acto::core::msg_t,_std::default_delete<acto::core::msg_t>_>::~unique_ptr
              (&local_30);
    std::
    unique_ptr<acto::core::msg_wrap_t<msg_start>,_std::default_delete<acto::core::msg_wrap_t<msg_start>_>_>
    ::~unique_ptr(&local_38);
  }
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

inline bool send(P&&... p) const {
    if (!object_) {
      return false;
    }

    return send_message(
      std::make_unique<core::msg_wrap_t<std::remove_cvref_t<Msg>>>(
        std::forward<P>(p)...));
  }